

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

bool __thiscall
ON_ObjectArray<ON_BrepRegion>::HeapSort
          (ON_ObjectArray<ON_BrepRegion> *this,_func_int_ON_BrepRegion_ptr_ON_BrepRegion_ptr *compar
          )

{
  int local_20;
  bool local_19;
  int i;
  bool rc;
  _func_int_ON_BrepRegion_ptr_ON_BrepRegion_ptr *compar_local;
  ON_ObjectArray<ON_BrepRegion> *this_local;
  
  local_19 = false;
  if ((((this->super_ON_ClassArray<ON_BrepRegion>).m_a != (ON_BrepRegion *)0x0) &&
      (0 < (this->super_ON_ClassArray<ON_BrepRegion>).m_count)) &&
     (compar != (_func_int_ON_BrepRegion_ptr_ON_BrepRegion_ptr *)0x0)) {
    if (1 < (this->super_ON_ClassArray<ON_BrepRegion>).m_count) {
      ON_hsort((this->super_ON_ClassArray<ON_BrepRegion>).m_a,
               (long)(this->super_ON_ClassArray<ON_BrepRegion>).m_count,0x78,
               (_func_int_void_ptr_void_ptr *)compar);
      for (local_20 = 0; local_20 < (this->super_ON_ClassArray<ON_BrepRegion>).m_count;
          local_20 = local_20 + 1) {
        (*(this->super_ON_ClassArray<ON_BrepRegion>).m_a[local_20].super_ON_Object._vptr_ON_Object
          [5])();
      }
    }
    local_19 = true;
  }
  return local_19;
}

Assistant:

bool ON_ObjectArray<T>::HeapSort( int (*compar)(const T*,const T*) )
{
  bool rc = false;
  // The "this->" in this->m_count and this->m_a 
  // are needed for gcc 4 to compile.
  if ( this->m_a && this->m_count > 0 && compar ) 
  {
    if ( this->m_count > 1 )
    {
      ON_hsort( this->m_a, this->m_count, sizeof(T), (int(*)(const void*,const void*))compar );
      
      // The MemoryRelocate step is required to synch userdata back pointers
      // so the user data destructor will work correctly.
      int i;
      for ( i = 0; i < this->m_count; i++ )
      {
        this->m_a[i].MemoryRelocate();
      }
    }
    rc = true;
  }
  return rc;
}